

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

CustomLayerParams_CustomLayerParamValue *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::CustomLayerParams_CustomLayerParamValue>(Arena *arena)

{
  CustomLayerParams_CustomLayerParamValue *this;
  
  if (arena == (Arena *)0x0) {
    this = (CustomLayerParams_CustomLayerParamValue *)operator_new(0x20);
    CoreML::Specification::CustomLayerParams_CustomLayerParamValue::
    CustomLayerParams_CustomLayerParamValue(this,(Arena *)0x0,false);
  }
  else {
    this = (CustomLayerParams_CustomLayerParamValue *)
           AllocateAlignedWithHook
                     (arena,0x20,
                      (type_info *)
                      &CoreML::Specification::CustomLayerParams_CustomLayerParamValue::typeinfo);
    CoreML::Specification::CustomLayerParams_CustomLayerParamValue::
    CustomLayerParams_CustomLayerParamValue(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }